

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-test.c++
# Opt level: O2

void __thiscall capnp::compiler::anon_unknown_0::TestCase236::run(TestCase236 *this)

{
  int iVar1;
  char *pcVar2;
  StringPtr constText;
  StringPtr constText_00;
  StringPtr constText_01;
  StringPtr constText_02;
  StringPtr constText_03;
  StringPtr constText_04;
  StringPtr constText_05;
  StringPtr constText_06;
  StringPtr constText_07;
  StringPtr constText_08;
  StringPtr constText_09;
  StringPtr constText_10;
  StringPtr constText_11;
  StringPtr constText_12;
  StringPtr constText_13;
  StringPtr constText_14;
  Array<char> local_38;
  char *local_20;
  
  constText.content.size_ = 0x11;
  constText.content.ptr = "foo; # blah blah";
  doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText);
  pcVar2 = local_38.ptr;
  if (local_38.size_ == 0) {
    pcVar2 = "";
  }
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'blah blah\\n\', startByte = 0, endByte = 16)])"
                 ,pcVar2);
  kj::Array<char>::~Array(&local_38);
  if ((iVar1 != 0) && (kj::_::Debug::minSeverity < 3)) {
    constText_00.content.size_ = 0x11;
    constText_00.content.ptr = "foo; # blah blah";
    doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText_00);
    local_20 = local_38.ptr;
    if (local_38.size_ == 0) {
      local_20 = "";
    }
    kj::_::Debug::log<char_const(&)[262],char_const(&)[149],char_const*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
               ,0xf8,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"line = void, \\\" \\\"docComment = \'blah blah\\\\\\\\n\', \\\" \\\"startByte = 0, endByte = 16\\\" \\\")\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo; # blah blah\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 16\" \")\" \"])\", doLex<LexedStatements>(\"foo; # blah blah\").cStr()"
               ,(char (*) [262])
                "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 16\" \")\" \"])\", doLex<LexedStatements>(\"foo; # blah blah\").cStr()) == 0"
               ,(char (*) [149])
                "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'blah blah\\n\', startByte = 0, endByte = 16)])"
               ,&local_20);
    kj::Array<char>::~Array(&local_38);
  }
  constText_01.content.size_ = 0x10;
  constText_01.content.ptr = "foo; #blah blah";
  doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText_01);
  pcVar2 = local_38.ptr;
  if (local_38.size_ == 0) {
    pcVar2 = "";
  }
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'blah blah\\n\', startByte = 0, endByte = 15)])"
                 ,pcVar2);
  kj::Array<char>::~Array(&local_38);
  if ((iVar1 != 0) && (kj::_::Debug::minSeverity < 3)) {
    constText_02.content.size_ = 0x10;
    constText_02.content.ptr = "foo; #blah blah";
    doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText_02);
    local_20 = local_38.ptr;
    if (local_38.size_ == 0) {
      local_20 = "";
    }
    kj::_::Debug::log<char_const(&)[261],char_const(&)[149],char_const*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
               ,0x105,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"line = void, \\\" \\\"docComment = \'blah blah\\\\\\\\n\', \\\" \\\"startByte = 0, endByte = 15\\\" \\\")\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo; #blah blah\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 15\" \")\" \"])\", doLex<LexedStatements>(\"foo; #blah blah\").cStr()"
               ,(char (*) [261])
                "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 15\" \")\" \"])\", doLex<LexedStatements>(\"foo; #blah blah\").cStr()) == 0"
               ,(char (*) [149])
                "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'blah blah\\n\', startByte = 0, endByte = 15)])"
               ,&local_20);
    kj::Array<char>::~Array(&local_38);
  }
  constText_03.content.size_ = 0x12;
  constText_03.content.ptr = "foo; #  blah blah";
  doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText_03);
  pcVar2 = local_38.ptr;
  if (local_38.size_ == 0) {
    pcVar2 = "";
  }
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \' blah blah\\n\', startByte = 0, endByte = 17)])"
                 ,pcVar2);
  kj::Array<char>::~Array(&local_38);
  if ((iVar1 != 0) && (kj::_::Debug::minSeverity < 3)) {
    constText_04.content.size_ = 0x12;
    constText_04.content.ptr = "foo; #  blah blah";
    doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText_04);
    local_20 = local_38.ptr;
    if (local_38.size_ == 0) {
      local_20 = "";
    }
    kj::_::Debug::log<char_const(&)[264],char_const(&)[150],char_const*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
               ,0x112,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"line = void, \\\" \\\"docComment = \' blah blah\\\\\\\\n\', \\\" \\\"startByte = 0, endByte = 17\\\" \\\")\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo; #  blah blah\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \' blah blah\\\\n\', \" \"startByte = 0, endByte = 17\" \")\" \"])\", doLex<LexedStatements>(\"foo; #  blah blah\").cStr()"
               ,(char (*) [264])
                "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \' blah blah\\\\n\', \" \"startByte = 0, endByte = 17\" \")\" \"])\", doLex<LexedStatements>(\"foo; #  blah blah\").cStr()) == 0"
               ,(char (*) [150])
                "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \' blah blah\\n\', startByte = 0, endByte = 17)])"
               ,&local_20);
    kj::Array<char>::~Array(&local_38);
  }
  constText_05.content.size_ = 0x11;
  constText_05.content.ptr = "foo;\n# blah blah";
  doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText_05);
  pcVar2 = local_38.ptr;
  if (local_38.size_ == 0) {
    pcVar2 = "";
  }
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'blah blah\\n\', startByte = 0, endByte = 16)])"
                 ,pcVar2);
  kj::Array<char>::~Array(&local_38);
  if ((iVar1 != 0) && (kj::_::Debug::minSeverity < 3)) {
    constText_06.content.size_ = 0x11;
    constText_06.content.ptr = "foo;\n# blah blah";
    doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText_06);
    local_20 = local_38.ptr;
    if (local_38.size_ == 0) {
      local_20 = "";
    }
    kj::_::Debug::log<char_const(&)[263],char_const(&)[149],char_const*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
               ,0x11f,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"line = void, \\\" \\\"docComment = \'blah blah\\\\\\\\n\', \\\" \\\"startByte = 0, endByte = 16\\\" \\\")\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo;\\\\n# blah blah\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 16\" \")\" \"])\", doLex<LexedStatements>(\"foo;\\n# blah blah\").cStr()"
               ,(char (*) [263])
                "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 16\" \")\" \"])\", doLex<LexedStatements>(\"foo;\\n# blah blah\").cStr()) == 0"
               ,(char (*) [149])
                "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'blah blah\\n\', startByte = 0, endByte = 16)])"
               ,&local_20);
    kj::Array<char>::~Array(&local_38);
  }
  constText_07.content.size_ = 0x12;
  constText_07.content.ptr = "foo;\n\n# blah blah";
  doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText_07);
  pcVar2 = local_38.ptr;
  if (local_38.size_ == 0) {
    pcVar2 = "";
  }
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, startByte = 0, endByte = 4)])"
                 ,pcVar2);
  kj::Array<char>::~Array(&local_38);
  if ((iVar1 != 0) && (kj::_::Debug::minSeverity < 3)) {
    constText_08.content.size_ = 0x12;
    constText_08.content.ptr = "foo;\n\n# blah blah";
    doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText_08);
    local_20 = local_38.ptr;
    if (local_38.size_ == 0) {
      local_20 = "";
    }
    kj::_::Debug::log<char_const(&)[232],char_const(&)[120],char_const*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
               ,299,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"line = void, \\\" \\\"startByte = 0, endByte = 4\\\" \\\")\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo;\\\\n\\\\n# blah blah\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"startByte = 0, endByte = 4\" \")\" \"])\", doLex<LexedStatements>(\"foo;\\n\\n# blah blah\").cStr()"
               ,(char (*) [232])
                "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"startByte = 0, endByte = 4\" \")\" \"])\", doLex<LexedStatements>(\"foo;\\n\\n# blah blah\").cStr()) == 0"
               ,(char (*) [120])
                "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, startByte = 0, endByte = 4)])"
               ,&local_20);
    kj::Array<char>::~Array(&local_38);
  }
  constText_09.content.size_ = 0x31;
  constText_09.content.ptr = "foo;\n # bar baz\n  # qux corge\n\n# grault\n# garply";
  doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText_09);
  pcVar2 = local_38.ptr;
  if (local_38.size_ == 0) {
    pcVar2 = "";
  }
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'bar baz\\nqux corge\\n\', startByte = 0, endByte = 30)])"
                 ,pcVar2);
  kj::Array<char>::~Array(&local_38);
  if ((iVar1 != 0) && (kj::_::Debug::minSeverity < 3)) {
    constText_10.content.size_ = 0x31;
    constText_10.content.ptr = "foo;\n # bar baz\n  # qux corge\n\n# grault\n# garply";
    doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText_10);
    local_20 = local_38.ptr;
    if (local_38.size_ == 0) {
      local_20 = "";
    }
    kj::_::Debug::log<char_const(&)[309],char_const(&)[158],char_const*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
               ,0x138,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"line = void, \\\" \\\"docComment = \'bar baz\\\\\\\\nqux corge\\\\\\\\n\', \\\" \\\"startByte = 0, endByte = 30\\\" \\\")\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo;\\\\n # bar baz\\\\n  # qux corge\\\\n\\\\n# grault\\\\n# garply\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'bar baz\\\\nqux corge\\\\n\', \" \"startByte = 0, endByte = 30\" \")\" \"])\", doLex<LexedStatements>(\"foo;\\n # bar baz\\n  # qux corge\\n\\n# grault\\n# garply\").cStr()"
               ,(char (*) [309])
                "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"line = void, \" \"docComment = \'bar baz\\\\nqux corge\\\\n\', \" \"startByte = 0, endByte = 30\" \")\" \"])\", doLex<LexedStatements>(\"foo;\\n # bar baz\\n  # qux corge\\n\\n# grault\\n# garply\").cStr()) == 0"
               ,(char (*) [158])
                "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], line = void, docComment = \'bar baz\\nqux corge\\n\', startByte = 0, endByte = 30)])"
               ,&local_20);
    kj::Array<char>::~Array(&local_38);
  }
  constText_11.content.size_ = 0x31;
  constText_11.content.ptr = "foo {# blah blah\nbar; # hi\n baz;} # ignored\nqux;";
  doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText_11);
  pcVar2 = local_38.ptr;
  if (local_38.size_ == 0) {
    pcVar2 = "";
  }
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], block = [(tokens = [(identifier = \'bar\', startByte = 17, endByte = 20)], line = void, docComment = \'hi\\n\', startByte = 17, endByte = 27), (tokens = [(identifier = \'baz\', startByte = 28, endByte = 31)], line = void, startByte = 28, endByte = 32)], docComment = \'blah blah\\n\', startByte = 0, endByte = 44), (tokens = [(identifier = \'qux\', startByte = 44, endByte = 47)], line = void, startByte = 44, endByte = 48)])"
                 ,pcVar2);
  kj::Array<char>::~Array(&local_38);
  if ((iVar1 != 0) && (kj::_::Debug::minSeverity < 3)) {
    constText_12.content.size_ = 0x31;
    constText_12.content.ptr = "foo {# blah blah\nbar; # hi\n baz;} # ignored\nqux;";
    doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText_12);
    local_20 = local_38.ptr;
    if (local_38.size_ == 0) {
      local_20 = "";
    }
    kj::_::Debug::log<char_const(&)[670],char_const(&)[491],char_const*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
               ,0x14f,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"block = [\\\" \\\"(tokens = [\\\" \\\"(identifier = \'bar\', startByte = 17, endByte = 20)\\\" \\\"], line = void, docComment = \'hi\\\\\\\\n\', startByte = 17, endByte = 27), \\\" \\\"(tokens = [\\\" \\\"(identifier = \'baz\', startByte = 28, endByte = 31)\\\" \\\"], line = void, startByte = 28, endByte = 32)\\\" \\\"], \\\" \\\"docComment = \'blah blah\\\\\\\\n\', \\\" \\\"startByte = 0, endByte = 44\\\" \\\"), \\\" \\\"(tokens = [\\\" \\\"(identifier = \'qux\', startByte = 44, endByte = 47)\\\" \\\"], line = void, startByte = 44, endByte = 48)\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo {# blah blah\\\\nbar; # hi\\\\n baz;} # ignored\\\\nqux;\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"block = [\" \"(tokens = [\" \"(identifier = \'bar\', startByte = 17, endByte = 20)\" \"], line = void, docComment = \'hi\\\\n\', startByte = 17, endByte = 27), \" \"(tokens = [\" \"(identifier = \'baz\', startByte = 28, endByte = 31)\" \"], line = void, startByte = 28, endByte = 32)\" \"], \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 44\" \"), \" \"(tokens = [\" \"(identifier = \'qux\', startByte = 44, endByte = 47)\" \"], line = void, startByte = 44, endByte = 48)\" \"])\", doLex<LexedStatements>(\"foo {# blah blah\\nbar; # hi\\n baz;} # ignored\\nqux;\").cStr()"
               ,(char (*) [670])
                "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"block = [\" \"(tokens = [\" \"(identifier = \'bar\', startByte = 17, endByte = 20)\" \"], line = void, docComment = \'hi\\\\n\', startByte = 17, endByte = 27), \" \"(tokens = [\" \"(identifier = \'baz\', startByte = 28, endByte = 31)\" \"], line = void, startByte = 28, endByte = 32)\" \"], \" \"docComment = \'blah blah\\\\n\', \" \"startByte = 0, endByte = 44\" \"), \" \"(tokens = [\" \"(identifier = \'qux\', startByte = 44, endByte = 47)\" \"], line = void, startByte = 44, endByte = 48)\" \"])\", doLex<LexedStatements>(\"foo {# blah blah\\nbar; # hi\\n baz;} # ignored\\nqux;\").cStr()) == 0"
               ,(char (*) [491])
                "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], block = [(tokens = [(identifier = \'bar\', startByte = 17, endByte = 20)], line = void, docComment = \'hi\\n\', startByte = 17, endByte = 27), (tokens = [(identifier = \'baz\', startByte = 28, endByte = 31)], line = void, startByte = 28, endByte = 32)], docComment = \'blah blah\\n\', startByte = 0, endByte = 44), (tokens = [(identifier = \'qux\', startByte = 44, endByte = 47)], line = void, startByte = 44, endByte = 48)])"
               ,&local_20);
    kj::Array<char>::~Array(&local_38);
  }
  constText_13.content.size_ = 0x24;
  constText_13.content.ptr = "foo {bar; baz;}\n# late comment\nqux;";
  doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText_13);
  pcVar2 = local_38.ptr;
  if (local_38.size_ == 0) {
    pcVar2 = "";
  }
  iVar1 = strcmp("(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], block = [(tokens = [(identifier = \'bar\', startByte = 5, endByte = 8)], line = void, startByte = 5, endByte = 9), (tokens = [(identifier = \'baz\', startByte = 10, endByte = 13)], line = void, startByte = 10, endByte = 14)], docComment = \'late comment\\n\', startByte = 0, endByte = 31), (tokens = [(identifier = \'qux\', startByte = 31, endByte = 34)], line = void, startByte = 31, endByte = 35)])"
                 ,pcVar2);
  kj::Array<char>::~Array(&local_38);
  if ((iVar1 != 0) && (kj::_::Debug::minSeverity < 3)) {
    constText_14.content.size_ = 0x24;
    constText_14.content.ptr = "foo {bar; baz;}\n# late comment\nqux;";
    doLex<capnp::compiler::LexedStatements>((String *)&local_38,constText_14);
    if (local_38.size_ == 0) {
      local_38.ptr = "";
    }
    local_20 = local_38.ptr;
    kj::_::Debug::log<char_const(&)[633],char_const(&)[469],char_const*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
               ,0x166,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"(statements = [\\\" \\\"(\\\" \\\"tokens = [\\\" \\\"(identifier = \'foo\', startByte = 0, endByte = 3)\\\" \\\"], \\\" \\\"block = [\\\" \\\"(tokens = [\\\" \\\"(identifier = \'bar\', startByte = 5, endByte = 8)\\\" \\\"], line = void, startByte = 5, endByte = 9), \\\" \\\"(tokens = [\\\" \\\"(identifier = \'baz\', startByte = 10, endByte = 13)\\\" \\\"], line = void, startByte = 10, endByte = 14)\\\" \\\"], \\\" \\\"docComment = \'late comment\\\\\\\\n\', \\\" \\\"startByte = 0, endByte = 31\\\" \\\"), \\\" \\\"(tokens = [\\\" \\\"(identifier = \'qux\', startByte = 31, endByte = 34)\\\" \\\"], line = void, startByte = 31, endByte = 35)\\\" \\\"])\\\", doLex<LexedStatements>(\\\"foo {bar; baz;}\\\\n# late comment\\\\nqux;\\\").cStr()) == 0\", \"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"block = [\" \"(tokens = [\" \"(identifier = \'bar\', startByte = 5, endByte = 8)\" \"], line = void, startByte = 5, endByte = 9), \" \"(tokens = [\" \"(identifier = \'baz\', startByte = 10, endByte = 13)\" \"], line = void, startByte = 10, endByte = 14)\" \"], \" \"docComment = \'late comment\\\\n\', \" \"startByte = 0, endByte = 31\" \"), \" \"(tokens = [\" \"(identifier = \'qux\', startByte = 31, endByte = 34)\" \"], line = void, startByte = 31, endByte = 35)\" \"])\", doLex<LexedStatements>(\"foo {bar; baz;}\\n# late comment\\nqux;\").cStr()"
               ,(char (*) [633])
                "failed: expected ::strcmp(\"(statements = [\" \"(\" \"tokens = [\" \"(identifier = \'foo\', startByte = 0, endByte = 3)\" \"], \" \"block = [\" \"(tokens = [\" \"(identifier = \'bar\', startByte = 5, endByte = 8)\" \"], line = void, startByte = 5, endByte = 9), \" \"(tokens = [\" \"(identifier = \'baz\', startByte = 10, endByte = 13)\" \"], line = void, startByte = 10, endByte = 14)\" \"], \" \"docComment = \'late comment\\\\n\', \" \"startByte = 0, endByte = 31\" \"), \" \"(tokens = [\" \"(identifier = \'qux\', startByte = 31, endByte = 34)\" \"], line = void, startByte = 31, endByte = 35)\" \"])\", doLex<LexedStatements>(\"foo {bar; baz;}\\n# late comment\\nqux;\").cStr()) == 0"
               ,(char (*) [469])
                "(statements = [(tokens = [(identifier = \'foo\', startByte = 0, endByte = 3)], block = [(tokens = [(identifier = \'bar\', startByte = 5, endByte = 8)], line = void, startByte = 5, endByte = 9), (tokens = [(identifier = \'baz\', startByte = 10, endByte = 13)], line = void, startByte = 10, endByte = 14)], docComment = \'late comment\\n\', startByte = 0, endByte = 31), (tokens = [(identifier = \'qux\', startByte = 31, endByte = 34)], line = void, startByte = 31, endByte = 35)])"
               ,&local_20);
    kj::Array<char>::~Array(&local_38);
  }
  return;
}

Assistant:

TEST(Lexer, DocComments) {
  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "line = void, "
          "docComment = 'blah blah\\n', "
          "startByte = 0, endByte = 16"
        ")"
      "])",
      doLex<LexedStatements>("foo; # blah blah").cStr());

  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "line = void, "
          "docComment = 'blah blah\\n', "
          "startByte = 0, endByte = 15"
        ")"
      "])",
      doLex<LexedStatements>("foo; #blah blah").cStr());

  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "line = void, "
          "docComment = ' blah blah\\n', "
          "startByte = 0, endByte = 17"
        ")"
      "])",
      doLex<LexedStatements>("foo; #  blah blah").cStr());

  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "line = void, "
          "docComment = 'blah blah\\n', "
          "startByte = 0, endByte = 16"
        ")"
      "])",
      doLex<LexedStatements>("foo;\n# blah blah").cStr());

  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "line = void, "
          "startByte = 0, endByte = 4"
        ")"
      "])",
      doLex<LexedStatements>("foo;\n\n# blah blah").cStr());

  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "line = void, "
          "docComment = 'bar baz\\nqux corge\\n', "
          "startByte = 0, endByte = 30"
        ")"
      "])",
      doLex<LexedStatements>("foo;\n # bar baz\n  # qux corge\n\n# grault\n# garply").cStr());

  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "block = ["
            "(tokens = ["
              "(identifier = 'bar', startByte = 17, endByte = 20)"
            "], line = void, docComment = 'hi\\n', startByte = 17, endByte = 27), "
            "(tokens = ["
              "(identifier = 'baz', startByte = 28, endByte = 31)"
            "], line = void, startByte = 28, endByte = 32)"
          "], "
          "docComment = 'blah blah\\n', "
          "startByte = 0, endByte = 44"
        "), "
        "(tokens = ["
          "(identifier = 'qux', startByte = 44, endByte = 47)"
        "], line = void, startByte = 44, endByte = 48)"
      "])",
      doLex<LexedStatements>("foo {# blah blah\nbar; # hi\n baz;} # ignored\nqux;").cStr());

  EXPECT_STREQ(
      "(statements = ["
        "("
          "tokens = ["
            "(identifier = 'foo', startByte = 0, endByte = 3)"
          "], "
          "block = ["
            "(tokens = ["
              "(identifier = 'bar', startByte = 5, endByte = 8)"
            "], line = void, startByte = 5, endByte = 9), "
            "(tokens = ["
              "(identifier = 'baz', startByte = 10, endByte = 13)"
            "], line = void, startByte = 10, endByte = 14)"
          "], "
          "docComment = 'late comment\\n', "
          "startByte = 0, endByte = 31"
        "), "
        "(tokens = ["
          "(identifier = 'qux', startByte = 31, endByte = 34)"
        "], line = void, startByte = 31, endByte = 35)"
      "])",
      doLex<LexedStatements>("foo {bar; baz;}\n# late comment\nqux;").cStr());
}